

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

Vec_Int_t * Gia_ManSimSimulateOne(Gia_Man_t *p,Vec_Int_t *vPat)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int v;
  int iVar8;
  
  if (vPat->nSize % (p->vCis->nSize - p->nRegs) != 0) {
    __assert_fail("Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x2c4,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
  iVar5 = 0;
  while ((iVar5 < p->nRegs &&
         (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff;
    iVar5 = iVar5 + 1;
  }
  p_00 = Vec_IntAlloc(1000);
  iVar7 = 0;
  iVar5 = 0;
  while( true ) {
    iVar8 = p->vCis->nSize;
    iVar6 = p->nRegs;
    if (vPat->nSize / (iVar8 - iVar6) <= iVar7) break;
    v = 0;
    while ((v < iVar8 - iVar6 && (pGVar3 = Gia_ManCi(p,v), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar2 = Vec_IntEntry(vPat,iVar5 + v);
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff | (ulong)(uVar2 & 1) << 0x3e;
      v = v + 1;
      iVar8 = p->vCis->nSize;
      iVar6 = p->nRegs;
    }
    iVar8 = 0;
    while ((iVar8 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar8), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(ulong *)pGVar3;
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
        uVar2 = (uint)(uVar1 >> 0x20);
        *(ulong *)pGVar3 =
             uVar1 & 0xbfffffff7fffffff |
             ((ulong)((uVar2 >> 0x1d ^
                      (uint)((ulong)*(undefined8 *)(pGVar3 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x3e))
                     & ((uint)((ulong)*(undefined8 *)(pGVar3 + -(uVar1 & 0x1fffffff)) >> 0x3e) ^
                       (uint)(uVar1 >> 0x1d) & 7)) & 1) << 0x3e;
      }
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar8), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           uVar1 & 0xbfffffffffffffff |
           (uVar1 << 0x21 ^ *(ulong *)(pGVar3 + -(ulong)((uint)uVar1 & 0x1fffffff))) &
           0x4000000000000000;
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCos->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCo(p,iVar8), pGVar3 != (Gia_Obj_t *)0x0))) {
      Vec_IntPush(p_00,(uint)((ulong)*(undefined8 *)pGVar3 >> 0x3e) & 1);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while (((iVar8 < p->nRegs &&
            (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8), pGVar3 != (Gia_Obj_t *)0x0))
           && (pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8), pGVar4 != (Gia_Obj_t *)0x0
              ))) {
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xbfffffffffffffff | *(ulong *)pGVar3 & 0x4000000000000000;
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 + 1;
    iVar5 = iVar5 + v;
  }
  if (iVar5 == vPat->nSize) {
    iVar5 = 0;
    while( true ) {
      if (p->nObjs <= iVar5) {
        return p_00;
      }
      pGVar3 = Gia_ManObj(p,iVar5);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff;
      iVar5 = iVar5 + 1;
    }
    return p_00;
  }
  __assert_fail("k == Vec_IntSize(vPat)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                ,0x2d6,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManSimSimulateOne( Gia_Man_t * p, Vec_Int_t * vPat )
{
    Vec_Int_t * vPatOut;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k, f;
    assert( Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0 );
    Gia_ManConst0(p)->fMark1 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark1 = 0;
    vPatOut = Vec_IntAlloc( 1000 );
    for ( k = f = 0; f < Vec_IntSize(vPat) / Gia_ManPiNum(p); f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark1 = Vec_IntEntry( vPat, k++ );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vPatOut, pObj->fMark1 );
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->fMark1 = pObj->fMark1;
    }
    assert( k == Vec_IntSize(vPat) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark1 = 0;
    return vPatOut;
}